

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_sbcd_mem(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGv_i32 local_40;
  TCGv_i32 addr;
  TCGv_i32 dest;
  TCGv_i32 src;
  TCGContext_conflict2 *tcg_ctx;
  DisasContext_conflict2 *pDStack_18;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  src = (TCGv_i32)s->uc->tcg_ctx;
  tcg_ctx._6_2_ = insn;
  pDStack_18 = s;
  s_local = (DisasContext_conflict2 *)env;
  gen_flush_flags(s);
  dest = gen_ea_mode((CPUM68KState_conflict *)s_local,pDStack_18,4,tcg_ctx._6_2_ & 7,0,
                     *(TCGv_i32 *)(src + 0x94f8),(TCGv_i32 *)0x0,EA_LOADU,
                     (uint)(((((pDStack_18->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
  addr = gen_ea_mode((CPUM68KState_conflict *)s_local,pDStack_18,4,(int)(uint)tcg_ctx._6_2_ >> 9 & 7
                     ,0,*(TCGv_i32 *)(src + 0x94f8),&local_40,EA_LOADU,
                     (uint)(((((pDStack_18->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
  bcd_sub((TCGContext_conflict2 *)src,addr,dest);
  gen_ea_mode((CPUM68KState_conflict *)s_local,pDStack_18,4,(int)(uint)tcg_ctx._6_2_ >> 9 & 7,0,addr
              ,&local_40,EA_STORE,
              (uint)(((((pDStack_18->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
  bcd_flags((TCGContext_conflict2 *)src,addr);
  return;
}

Assistant:

DISAS_INSN(sbcd_mem)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv src, dest, addr;

    gen_flush_flags(s); /* !Z is sticky */

    /* Indirect pre-decrement load (mode 4) */

    src = gen_ea_mode(env, s, 4, REG(insn, 0), OS_BYTE,
                      tcg_ctx->NULL_QREG, NULL, EA_LOADU, IS_USER(s));
    dest = gen_ea_mode(env, s, 4, REG(insn, 9), OS_BYTE,
                       tcg_ctx->NULL_QREG, &addr, EA_LOADU, IS_USER(s));

    bcd_sub(tcg_ctx, dest, src);

    gen_ea_mode(env, s, 4, REG(insn, 9), OS_BYTE, dest, &addr,
                EA_STORE, IS_USER(s));

    bcd_flags(tcg_ctx, dest);
}